

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::gcd(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float_t fVar1;
  float_t fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  if (((0.0 < wm->z) && (fVar2 = 0.0, 0.0 < wi->z)) && (0.0 < wo->z)) {
    fVar2 = sigma(this,wi,args);
    fVar1 = sigma(this,wo,args);
    fVar3 = fVar2 * wo->z;
    fVar2 = fVar3 / ((fVar1 * wi->z + fVar3) - wi->z * wo->z);
  }
  return fVar2;
}

Assistant:

float_t
microfacet::gcd(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		float_t tmp = wo.z * sigma_i;
		return tmp / (wi.z * sigma_o + tmp - wi.z * wo.z);
	}
	return 0;
}